

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBblif.c
# Opt level: O1

void Bbl_ManDfs_rec(Bbl_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  int iVar2;
  Bbl_Obj_t *pObj_00;
  void **ppvVar3;
  
  iVar2 = Bbl_ObjIsMarked(pObj);
  if (iVar2 != 0) {
    return;
  }
  iVar2 = Bbl_ObjIsInput(pObj);
  if (iVar2 != 0) {
    return;
  }
  for (pObj_00 = Bbl_ObjFaninFirst(pObj); pObj_00 != (Bbl_Obj_t *)0x0;
      pObj_00 = Bbl_ObjFaninNext(pObj,pObj_00)) {
    Bbl_ManDfs_rec(pObj_00,vNodes);
  }
  iVar2 = Bbl_ObjIsMarked(pObj);
  if (iVar2 != 0) {
    __assert_fail("!Bbl_ObjIsMarked(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/io/ioReadBblif.c"
                  ,0x70,"void Bbl_ManDfs_rec(Bbl_Obj_t *, Vec_Ptr_t *)");
  }
  Bbl_ObjMark(pObj);
  uVar1 = vNodes->nCap;
  if (vNodes->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar3;
      iVar2 = 0x10;
    }
    else {
      iVar2 = uVar1 * 2;
      if (iVar2 <= (int)uVar1) goto LAB_002d3599;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
      }
      vNodes->pArray = ppvVar3;
    }
    vNodes->nCap = iVar2;
  }
LAB_002d3599:
  iVar2 = vNodes->nSize;
  vNodes->nSize = iVar2 + 1;
  vNodes->pArray[iVar2] = pObj;
  return;
}

Assistant:

void Bbl_ManDfs_rec( Bbl_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    extern void Bbl_ObjMark( Bbl_Obj_t * p );
    extern int  Bbl_ObjIsMarked( Bbl_Obj_t * p );
    Bbl_Obj_t * pFanin;
    if ( Bbl_ObjIsMarked(pObj) || Bbl_ObjIsInput(pObj) )
        return;
    Bbl_ObjForEachFanin( pObj, pFanin )
        Bbl_ManDfs_rec( pFanin, vNodes );
    assert( !Bbl_ObjIsMarked(pObj) ); // checks if acyclic
    Bbl_ObjMark( pObj );
    Vec_PtrPush( vNodes, pObj );
}